

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list_functions.h
# Opt level: O2

Node<string_tokenizer::Token> *
LinkedList::insert_head<string_tokenizer::Token>(Node<string_tokenizer::Token> **head,Token *item)

{
  Node<string_tokenizer::Token> *this;
  Node<string_tokenizer::Token> *pNVar1;
  
  pNVar1 = *head;
  this = (Node<string_tokenizer::Token> *)operator_new(0x30);
  if (pNVar1 == (Node<string_tokenizer::Token> *)0x0) {
    string_tokenizer::Token::Token((Token *)this,item);
    pNVar1 = (Node<string_tokenizer::Token> *)0x0;
  }
  else {
    string_tokenizer::Token::Token((Token *)this,item);
  }
  this->_next = pNVar1;
  *head = this;
  return this;
}

Assistant:

Node<T>* insert_head(Node<T>*& head, const T& item) {
        Node<T>* node;
        if (head == NULL) {
            node = new Node<T>(item);
            head = node;
        } else {
            node = new Node<T>(item, head);
            head = node;
        }
        return node;
    }